

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

void lj_lib_register(lua_State *L,char *libname,uint8_t *p,lua_CFunction *cf)

{
  byte bVar1;
  undefined4 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t lenx;
  GCtab *pGVar6;
  long lVar7;
  TValue *pTVar8;
  GCstr *pGVar9;
  undefined8 *in_RCX;
  byte *pbVar10;
  size_t lenx_00;
  byte *in_RDX;
  cTValue *in_RDI;
  GCfunc *fn;
  MSize nuv;
  char *name;
  MSize len;
  uint32_t tag;
  ptrdiff_t tpos;
  GCtab *tab;
  BCIns *bcff;
  int ffid;
  GCfunc *ofn;
  GCtab *env;
  GCobj *o;
  char *in_stack_fffffffffffffda8;
  lua_State *in_stack_fffffffffffffdb0;
  cTValue *in_stack_fffffffffffffdb8;
  lua_State *in_stack_fffffffffffffdc0;
  cTValue *in_stack_fffffffffffffdc8;
  GCtab *in_stack_fffffffffffffdd0;
  cTValue *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffe18;
  GCfunc *pGVar11;
  GCfunc *L_00;
  undefined8 *local_1d0;
  byte *local_1c8;
  cTValue *in_stack_fffffffffffffe78;
  GCfunc *in_stack_fffffffffffffe80;
  TValue *in_stack_fffffffffffffe88;
  
  pGVar11 = (GCfunc *)0x0;
  uVar3 = (uint)*in_RDX;
  lenx = (ulong)in_RDI[1].u32.lo + 0x1480 + (ulong)in_RDX[1] * 4;
  pGVar6 = lib_create_table(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
  lVar7 = (long)(in_RDI[3].u64 - in_RDI[2].u64) >> 3;
  if ((pGVar6->marked & 4) != 0) {
    uVar4 = in_RDI[1].u32.lo;
    pGVar6->marked = pGVar6->marked & 0xfb;
    (pGVar6->gclist).gcptr32 = *(uint32_t *)((ulong)uVar4 + 0x6c);
    *(int *)((ulong)uVar4 + 0x6c) = (int)pGVar6;
  }
  pGVar6->nomm = '\0';
  local_1d0 = in_RCX;
  local_1c8 = in_RDX + 3;
  do {
    while( true ) {
      L_00 = pGVar11;
      pbVar10 = local_1c8 + 1;
      bVar1 = *local_1c8;
      uVar4 = (uint)bVar1;
      if ((uVar4 & 0xc0) != 0xc0) break;
      in_stack_fffffffffffffdc0 = (lua_State *)(ulong)(uVar4 - 0xf9);
      pGVar11 = L_00;
      switch(in_stack_fffffffffffffdc0) {
      case (lua_State *)0x0:
        local_1c8 = lib_read_lfunc((lua_State *)&in_stack_fffffffffffffe88->field_2,
                                   (uint8_t *)in_stack_fffffffffffffe80,
                                   (GCtab *)&in_stack_fffffffffffffe78->field_2);
        pGVar11 = L_00;
        break;
      case (lua_State *)0x1:
        in_RDI[3].u64 = in_RDI[3].u64 - 0x10;
        if ((*(int *)(in_RDI[3].u64 + 0xc) != -5) ||
           (local_1c8 = pbVar10, *(int *)((ulong)*(uint *)(in_RDI[3].u64 + 8) + 0xc) != 0)) {
          in_stack_fffffffffffffdb8 = in_RDI;
          pTVar8 = lj_tab_set((lua_State *)&in_stack_fffffffffffffdd8->field_2,
                              in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          *pTVar8 = (TValue)*in_RDI[3];
          pGVar11 = L_00;
          local_1c8 = pbVar10;
        }
        break;
      case (lua_State *)0x2:
        *(undefined8 *)in_RDI[3] = *(undefined8 *)pbVar10;
        in_RDI[3].u64 = in_RDI[3].u64 + 8;
        local_1c8 = local_1c8 + 9;
        break;
      case (lua_State *)0x3:
        *(undefined8 *)in_RDI[3] = *(undefined8 *)(in_RDI[3].u64 + (long)(int)(uint)*pbVar10 * -8);
        in_RDI[3].u64 = in_RDI[3].u64 + 8;
        local_1c8 = local_1c8 + 2;
        break;
      case (lua_State *)0x4:
        puVar2 = (undefined4 *)in_RDI[3].u64;
        in_RDI[3].u64 = (uint64_t)(puVar2 + 2);
        *puVar2 = (int)L_00;
        puVar2[1] = 0xfffffff7;
        local_1c8 = pbVar10;
        in_stack_fffffffffffffe78 = in_RDI;
        break;
      case (lua_State *)0x5:
        uVar3 = uVar3 + 1;
        local_1c8 = pbVar10;
        break;
      case (lua_State *)0x6:
        return;
      default:
        in_stack_fffffffffffffdb0 = (lua_State *)in_RDI[3].u64;
        in_RDI[3].u64 = (uint64_t)&in_stack_fffffffffffffdb0->glref;
        pGVar9 = lj_str_new((lua_State *)&L_00->c,(char *)CONCAT44(uVar3,in_stack_fffffffffffffe18),
                            lenx);
        (in_stack_fffffffffffffdb0->nextgc).gcptr32 = (uint32_t)pGVar9;
        in_stack_fffffffffffffdb0->marked = 0xfb;
        in_stack_fffffffffffffdb0->gct = 0xff;
        in_stack_fffffffffffffdb0->dummy_ffid = 0xff;
        in_stack_fffffffffffffdb0->status = 0xff;
        pGVar11 = L_00;
        local_1c8 = pbVar10 + (uVar4 & 0x3f);
      }
    }
    uVar5 = (int)((long)(in_RDI[3].u64 - in_RDI[2].u64) >> 3) - (int)lVar7;
    pGVar11 = lj_func_newC(in_stack_fffffffffffffdc0,
                           (MSize)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                           (GCtab *)in_stack_fffffffffffffdb0);
    if (uVar5 != 0) {
      in_RDI[3].u64 = in_RDI[2].u64 + lVar7 * 8;
      memcpy((pGVar11->c).upvalue,(void *)in_RDI[3],(ulong)uVar5 << 3);
    }
    uVar5 = uVar3 + 1;
    (pGVar11->c).ffid = (uint8_t)uVar3;
    local_1c8 = pbVar10 + (uVar4 & 0x3f);
    if ((bVar1 & 0xc0) == 0) {
      (pGVar11->c).pc.ptr32 = in_RDI[1].u32.lo + 0x180;
      lenx_00 = lenx;
    }
    else {
      lenx_00 = lenx + 4;
      (pGVar11->c).pc.ptr32 = (uint32_t)lenx;
    }
    if ((uVar4 & 0xc0) == 0x80) {
      (pGVar11->c).f = (L_00->c).f;
    }
    else {
      (pGVar11->c).f = (lua_CFunction)*local_1d0;
      local_1d0 = local_1d0 + 1;
    }
    lenx = lenx_00;
    uVar3 = uVar5;
    if ((bVar1 & 0x3f) != 0) {
      in_stack_fffffffffffffdc8 = in_RDI;
      in_stack_fffffffffffffdd0 = pGVar6;
      in_stack_fffffffffffffdd8 = in_RDI;
      lj_str_new((lua_State *)&L_00->c,(char *)CONCAT44(uVar5,in_stack_fffffffffffffe18),lenx_00);
      in_stack_fffffffffffffe88 =
           lj_tab_setstr((lua_State *)&in_stack_fffffffffffffdc8->field_2,
                         (GCtab *)in_stack_fffffffffffffdc0,
                         (GCstr *)&in_stack_fffffffffffffdb8->field_2);
      (in_stack_fffffffffffffe88->u32).lo = (uint32_t)pGVar11;
      (in_stack_fffffffffffffe88->field_2).it = 0xfffffff7;
      lenx = lenx_00;
      uVar3 = uVar5;
      in_stack_fffffffffffffe80 = pGVar11;
    }
  } while( true );
}

Assistant:

void lj_lib_register(lua_State *L, const char *libname,
		     const uint8_t *p, const lua_CFunction *cf)
{
  GCtab *env = tabref(L->env);
  GCfunc *ofn = NULL;
  int ffid = *p++;
  BCIns *bcff = &L2GG(L)->bcff[*p++];
  GCtab *tab = lib_create_table(L, libname, *p++);
  ptrdiff_t tpos = L->top - L->base;

  /* Avoid barriers further down. */
  lj_gc_anybarriert(L, tab);
  tab->nomm = 0;

  for (;;) {
    uint32_t tag = *p++;
    MSize len = tag & LIBINIT_LENMASK;
    tag &= LIBINIT_TAGMASK;
    if (tag != LIBINIT_STRING) {
      const char *name;
      MSize nuv = (MSize)(L->top - L->base - tpos);
      GCfunc *fn = lj_func_newC(L, nuv, env);
      if (nuv) {
	L->top = L->base + tpos;
	memcpy(fn->c.upvalue, L->top, sizeof(TValue)*nuv);
      }
      fn->c.ffid = (uint8_t)(ffid++);
      name = (const char *)p;
      p += len;
      if (tag == LIBINIT_CF)
	setmref(fn->c.pc, &G(L)->bc_cfunc_int);
      else
	setmref(fn->c.pc, bcff++);
      if (tag == LIBINIT_ASM_)
	fn->c.f = ofn->c.f;  /* Copy handler from previous function. */
      else
	fn->c.f = *cf++;  /* Get cf or handler from C function table. */
      if (len) {
	/* NOBARRIER: See above for common barrier. */
	setfuncV(L, lj_tab_setstr(L, tab, lj_str_new(L, name, len)), fn);
      }
      ofn = fn;
    } else {
      switch (tag | len) {
      case LIBINIT_LUA:
	p = lib_read_lfunc(L, p, tab);
	break;
      case LIBINIT_SET:
	L->top -= 2;
	if (tvisstr(L->top+1) && strV(L->top+1)->len == 0)
	  env = tabV(L->top);
	else  /* NOBARRIER: See above for common barrier. */
	  copyTV(L, lj_tab_set(L, tab, L->top+1), L->top);
	break;
      case LIBINIT_NUMBER:
	memcpy(&L->top->n, p, sizeof(double));
	L->top++;
	p += sizeof(double);
	break;
      case LIBINIT_COPY:
	copyTV(L, L->top, L->top - *p++);
	L->top++;
	break;
      case LIBINIT_LASTCL:
	setfuncV(L, L->top++, ofn);
	break;
      case LIBINIT_FFID:
	ffid++;
	break;
      case LIBINIT_END:
	return;
      default:
	setstrV(L, L->top++, lj_str_new(L, (const char *)p, len));
	p += len;
	break;
      }
    }
  }
}